

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

bool crnlib::rg_etc1::etc1_block::unpack_color5
               (uint *r,uint *g,uint *b,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  bool bVar1;
  undefined8 in_RAX;
  color_quad_u8 result;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar1 = unpack_color5((color_quad_u8 *)((long)&uStack_28 + 4),packed_color5,packed_delta3,scaled,
                        alpha);
  *r = (uint)uStack_28._4_1_;
  *g = (uint)uStack_28._5_1_;
  *b = (uint)uStack_28._6_1_;
  return bVar1;
}

Assistant:

bool etc1_block::unpack_color5(uint& r, uint& g, uint& b, uint16 packed_color5, uint16 packed_delta3, bool scaled, uint alpha)
        {
            color_quad_u8 result;
            const bool success = unpack_color5(result, packed_color5, packed_delta3, scaled, alpha);
            r = result.r;
            g = result.g;
            b = result.b;
            return success;
        }